

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

RelocInsert * initRelocInsert(RelocInsert *ri,uint16_t pos,uint16_t siz,lword msk)

{
  if (ri == (RelocInsert *)0x0) {
    ri = (RelocInsert *)alloc(0x18);
  }
  ri->next = (RelocInsert *)0x0;
  ri->bpos = pos;
  ri->bsiz = siz;
  ri->mask = msk;
  return ri;
}

Assistant:

struct RelocInsert *initRelocInsert(struct RelocInsert *ri,uint16_t pos,
                                    uint16_t siz,lword msk)
{
  if (ri == NULL)
    ri = alloc(sizeof(struct RelocInsert));
  ri->next = NULL;
  ri->bpos = pos;
  ri->bsiz = siz;
  ri->mask = msk;
  return ri;
}